

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionRequestPdu.cpp
# Opt level: O0

void __thiscall DIS::ActionRequestPdu::ActionRequestPdu(ActionRequestPdu *this)

{
  ActionRequestPdu *this_local;
  
  SimulationManagementFamilyPdu::SimulationManagementFamilyPdu
            (&this->super_SimulationManagementFamilyPdu);
  (this->super_SimulationManagementFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ActionRequestPdu_00266618;
  EntityID::EntityID(&this->_originatingID);
  EntityID::EntityID(&this->_receivingID);
  this->_requestID = 0;
  this->_actionID = 0;
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::vector(&this->_fixedDatums);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::vector
            (&this->_variableDatums);
  PduSuperclass::setPduType((PduSuperclass *)this,'\x10');
  return;
}

Assistant:

ActionRequestPdu::ActionRequestPdu() : SimulationManagementFamilyPdu(),
   _originatingID(), 
   _receivingID(), 
   _requestID(0), 
   _actionID(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 16 );
}